

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  ImRect *this;
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *window;
  ImGuiOldColumnData *pIVar4;
  ImGuiOldColumns *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  ImGuiID id;
  ImGuiOldColumns *columns;
  ImGuiOldColumns *pIVar11;
  ImGuiOldColumnData *pIVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ImGuiContext *g;
  bool bVar19;
  float fVar20;
  float fVar21;
  
  pIVar10 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  id = GetColumnsID(str_id,columns_count);
  pIVar11 = FindOrCreateColumns(window,id);
  pIVar11->Current = 0;
  pIVar11->Count = columns_count;
  pIVar11->Flags = flags;
  (window->DC).CurrentColumns = pIVar11;
  pIVar11->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar11->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar9 = (window->ClipRect).Max;
  (pIVar11->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar11->HostInitialClipRect).Max = IVar9;
  IVar9 = (window->ParentWorkRect).Max;
  (pIVar11->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar11->HostBackupParentWorkRect).Max = IVar9;
  IVar9 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar9;
  fVar1 = (pIVar10->Style).ItemSpacing.x;
  fVar20 = (window->WindowPadding).x;
  fVar21 = fVar20 * 0.5;
  uVar8 = vcmpss_avx512f(ZEXT416((uint)window->WindowBorderSize),ZEXT416((uint)fVar21),2);
  bVar19 = (bool)((byte)uVar8 & 1);
  auVar6 = vcvtdq2ps_avx(ZEXT416((uint)(int)(float)((uint)bVar19 * (int)fVar21 +
                                                   (uint)!bVar19 * (int)window->WindowBorderSize)));
  fVar21 = (window->WorkRect).Max.x;
  fVar20 = fVar1 - fVar20;
  uVar8 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar20),2);
  fVar20 = (float)((uint)((byte)uVar8 & 1) * (int)fVar20);
  auVar6 = vminss_avx(ZEXT416((uint)((fVar1 + fVar21) - fVar20)),
                      ZEXT416((uint)(fVar21 + auVar6._0_4_)));
  fVar20 = fVar20 + ((window->DC).Indent.x - fVar1);
  pIVar11->OffMinX = fVar20;
  fVar21 = auVar6._0_4_ - (window->Pos).x;
  fVar20 = fVar20 + 1.0;
  uVar8 = vcmpss_avx512f(ZEXT416((uint)fVar20),ZEXT416((uint)fVar21),2);
  bVar19 = (bool)((byte)uVar8 & 1);
  pIVar11->OffMaxX = (float)((uint)bVar19 * (int)fVar21 + (uint)!bVar19 * (int)fVar20);
  fVar20 = (window->DC).CursorPos.y;
  pIVar11->LineMaxY = fVar20;
  pIVar11->LineMinY = fVar20;
  iVar18 = (pIVar11->Columns).Size;
  iVar15 = columns_count + 1;
  if (iVar18 != iVar15 && iVar18 != 0) {
    iVar18 = (pIVar11->Columns).Capacity;
    if (iVar18 < 0) {
      uVar13 = iVar18 / 2 + iVar18;
      uVar13 = ~((int)uVar13 >> 0x1f) & uVar13;
      pIVar12 = (ImGuiOldColumnData *)MemAlloc((ulong)uVar13 * 0x1c);
      pIVar4 = (pIVar11->Columns).Data;
      if (pIVar4 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar12,pIVar4,(long)(pIVar11->Columns).Size * 0x1c);
        MemFree((pIVar11->Columns).Data);
      }
      (pIVar11->Columns).Data = pIVar12;
      (pIVar11->Columns).Capacity = uVar13;
    }
    (pIVar11->Columns).Size = 0;
  }
  bVar19 = (pIVar11->Columns).Size == 0;
  pIVar11->IsFirstFrame = bVar19;
  if (bVar19) {
    if ((pIVar11->Columns).Capacity <= columns_count) {
      pIVar12 = (ImGuiOldColumnData *)MemAlloc((long)iVar15 * 0x1c);
      pIVar4 = (pIVar11->Columns).Data;
      if (pIVar4 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar12,pIVar4,(long)(pIVar11->Columns).Size * 0x1c);
        MemFree((pIVar11->Columns).Data);
      }
      (pIVar11->Columns).Data = pIVar12;
      (pIVar11->Columns).Capacity = iVar15;
    }
    if (-1 < columns_count) {
      iVar18 = 0;
      do {
        iVar17 = (pIVar11->Columns).Size;
        iVar3 = (pIVar11->Columns).Capacity;
        if (iVar17 == iVar3) {
          if (iVar3 == 0) {
            iVar14 = 8;
          }
          else {
            iVar14 = iVar3 / 2 + iVar3;
          }
          iVar17 = iVar17 + 1;
          if (iVar17 < iVar14) {
            iVar17 = iVar14;
          }
          if (iVar3 < iVar17) {
            pIVar12 = (ImGuiOldColumnData *)MemAlloc((long)iVar17 * 0x1c);
            pIVar4 = (pIVar11->Columns).Data;
            if (pIVar4 != (ImGuiOldColumnData *)0x0) {
              memcpy(pIVar12,pIVar4,(long)(pIVar11->Columns).Size * 0x1c);
              MemFree((pIVar11->Columns).Data);
            }
            (pIVar11->Columns).Data = pIVar12;
            (pIVar11->Columns).Capacity = iVar17;
          }
        }
        pIVar4 = (pIVar11->Columns).Data;
        iVar17 = (pIVar11->Columns).Size;
        pIVar4[iVar17].OffsetNorm = (float)iVar18 / (float)columns_count;
        pIVar12 = pIVar4 + iVar17;
        pIVar12->OffsetNormBeforeResize = 0.0;
        pIVar12->Flags = 0;
        (((ImRect *)(&pIVar12->OffsetNormBeforeResize + 2))->Min).x = 0.0;
        (((ImRect *)(&pIVar12->OffsetNormBeforeResize + 2))->Min).y = 0.0;
        pIVar4[iVar17].ClipRect.Max.x = 0.0;
        pIVar4[iVar17].ClipRect.Max.y = 0.0;
        (pIVar11->Columns).Size = (pIVar11->Columns).Size + 1;
        iVar18 = iVar18 + 1;
      } while (iVar15 != iVar18);
    }
  }
  if (0 < columns_count) {
    lVar16 = 0;
    do {
      pIVar5 = (GImGui->CurrentWindow->DC).CurrentColumns;
      fVar21 = 0.0;
      fVar20 = 0.0;
      if (pIVar5 != (ImGuiOldColumns *)0x0) {
        auVar6 = vfmadd132ss_fma(ZEXT416((uint)(pIVar5->OffMaxX - pIVar5->OffMinX)),
                                 ZEXT416((uint)pIVar5->OffMinX),
                                 ZEXT416(*(uint *)((long)&((pIVar5->Columns).Data)->OffsetNorm +
                                                  lVar16)));
        fVar20 = auVar6._0_4_;
      }
      fVar2 = (window->Pos).x;
      if (pIVar5 != (ImGuiOldColumns *)0x0) {
        auVar6 = vfmadd132ss_fma(ZEXT416((uint)(pIVar5->OffMaxX - pIVar5->OffMinX)),
                                 ZEXT416((uint)pIVar5->OffMinX),
                                 ZEXT416(*(uint *)((long)&(pIVar5->Columns).Data[1].OffsetNorm +
                                                  lVar16)));
        fVar21 = auVar6._0_4_;
      }
      auVar6 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar2 + fVar20 + 0.5)));
      auVar7 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar2 + fVar21 + -1.0 + 0.5)));
      this = (ImRect *)((long)&(((pIVar11->Columns).Data)->ClipRect).Min.x + lVar16);
      (this->Min).x = auVar6._0_4_;
      (this->Min).y = -3.4028235e+38;
      (this->Max).x = auVar7._0_4_;
      (this->Max).y = 3.4028235e+38;
      ImRect::ClipWithFull(this,&window->ClipRect);
      lVar16 = lVar16 + 0x1c;
    } while ((ulong)(uint)columns_count * 0x1c != lVar16);
  }
  if (1 < pIVar11->Count) {
    ImDrawListSplitter::Split(&pIVar11->Splitter,window->DrawList,pIVar11->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar11->Splitter,window->DrawList,1);
    pIVar4 = (((GImGui->CurrentWindow->DC).CurrentColumns)->Columns).Data;
    PushClipRect(&(pIVar4->ClipRect).Min,&(pIVar4->ClipRect).Max,false);
  }
  iVar18 = pIVar11->Current;
  pIVar11 = (GImGui->CurrentWindow->DC).CurrentColumns;
  fVar21 = 0.0;
  fVar20 = 0.0;
  if (pIVar11 != (ImGuiOldColumns *)0x0) {
    iVar15 = iVar18;
    if (iVar18 < 0) {
      iVar15 = pIVar11->Current;
    }
    auVar6 = vfmadd132ss_fma(ZEXT416((uint)(pIVar11->OffMaxX - pIVar11->OffMinX)),
                             ZEXT416((uint)pIVar11->OffMinX),
                             ZEXT416((uint)(pIVar11->Columns).Data[iVar15].OffsetNorm));
    fVar20 = auVar6._0_4_;
  }
  if (pIVar11 != (ImGuiOldColumns *)0x0) {
    if (iVar18 < -1) {
      iVar18 = pIVar11->Current;
    }
    else {
      iVar18 = iVar18 + 1;
    }
    auVar6 = vfmadd132ss_fma(ZEXT416((uint)(pIVar11->OffMaxX - pIVar11->OffMinX)),
                             ZEXT416((uint)pIVar11->OffMinX),
                             ZEXT416((uint)(pIVar11->Columns).Data[iVar18].OffsetNorm));
    fVar21 = auVar6._0_4_;
  }
  PushItemWidth((fVar21 - fVar20) * 0.65);
  fVar2 = fVar1 - (window->WindowPadding).x;
  uVar8 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar2),2);
  fVar2 = (float)((uint)((byte)uVar8 & 1) * (int)fVar2);
  (window->DC).ColumnsOffset.x = fVar2;
  fVar20 = (window->Pos).x;
  auVar6 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar2 + fVar20 + (window->DC).Indent.x)));
  (window->DC).CursorPos.x = auVar6._0_4_;
  (window->WorkRect).Max.x = (fVar20 + fVar21) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}